

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompilationUnitSymbols.cpp
# Opt level: O3

void __thiscall
slang::ast::CompilationUnitSymbol::addMembers(CompilationUnitSymbol *this,SyntaxNode *syntax)

{
  long lVar1;
  SyntaxNode *pSVar2;
  long lVar3;
  
  if (syntax->kind == CompilationUnit) {
    lVar1 = *(long *)(syntax + 3);
    if (lVar1 != 0) {
      this->anyMembers = true;
      pSVar2 = syntax[2].previewNode;
      lVar3 = 0;
      do {
        Scope::addMembers(&this->super_Scope,*(SyntaxNode **)((long)&pSVar2->kind + lVar3));
        lVar3 = lVar3 + 8;
      } while (lVar1 << 3 != lVar3);
    }
    return;
  }
  if (syntax->kind == TimeUnitsDeclaration) {
    if ((this->timeScale).super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
        super__Optional_payload_base<slang::TimeScale>._M_engaged == false) {
      (this->timeScale).super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
      super__Optional_payload_base<slang::TimeScale>._M_payload =
           (_Storage<slang::TimeScale,_true>)0x1030103;
      (this->timeScale).super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
      super__Optional_payload_base<slang::TimeScale>._M_engaged = true;
    }
    SemanticFacts::populateTimeScale
              ((TimeScale *)&this->timeScale,&this->super_Scope,(TimeUnitsDeclarationSyntax *)syntax
               ,&this->unitsRange,&this->precisionRange,(bool)(this->anyMembers ^ 1));
    return;
  }
  this->anyMembers = true;
  Scope::addMembers(&this->super_Scope,syntax);
  return;
}

Assistant:

void CompilationUnitSymbol::addMembers(const SyntaxNode& syntax) {
    if (syntax.kind == SyntaxKind::TimeUnitsDeclaration) {
        if (!timeScale)
            timeScale.emplace();

        SemanticFacts::populateTimeScale(*timeScale, *this, syntax.as<TimeUnitsDeclarationSyntax>(),
                                         unitsRange, precisionRange, !anyMembers);
    }
    else if (syntax.kind == SyntaxKind::CompilationUnit) {
        auto& cu = syntax.as<CompilationUnitSyntax>();
        if (!cu.members.empty()) {
            anyMembers = true;
            for (auto member : cu.members)
                Scope::addMembers(*member);
        }
    }
    else {
        anyMembers = true;
        Scope::addMembers(syntax);
    }
}